

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::
swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage>
          (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
           *this,basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>
                 *other)

{
  bool_storage bVar1;
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>> bVar2;
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>> bVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  pointer phVar6;
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>> bVar7;
  common_storage cVar8;
  pointer phVar9;
  void *__src;
  ulong uVar10;
  bool_storage temp;
  undefined1 auStack_15e [14];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_150;
  undefined1 auStack_11e [22];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_108;
  undefined1 auStack_d6 [22];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_c0;
  undefined1 auStack_8e [22];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_78;
  undefined1 auStack_46 [22];
  
  bVar1 = (other->field_0).boolean_;
  switch((byte)bVar1 & 0xf) {
  case 0:
  case 4:
    cVar8 = (other->field_0).common_;
    (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
    (other->field_0).common_.tag_ = (semantic_tag)this[1];
    (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
    goto LAB_00792f96;
  case 1:
    bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )(other->field_0).short_str_.data_[0];
    cVar8 = (other->field_0).common_;
    (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
    (other->field_0).common_.tag_ = (semantic_tag)this[1];
    (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
    this[2] = bVar7;
LAB_00792f96:
    *(common_storage *)this = cVar8;
    return;
  default:
    uVar5 = *(undefined8 *)&other->field_0;
    phVar9 = (other->field_0).long_str_.ptr_;
    (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
    (other->field_0).common_.tag_ = (semantic_tag)this[1];
    (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
    *(undefined8 *)this = uVar5;
    *(pointer *)(this + 8) = phVar9;
    return;
  case 6:
    uVar4 = *(undefined4 *)&other->field_0;
    (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
    (other->field_0).common_.tag_ = (semantic_tag)this[1];
    (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
    *(undefined4 *)this = uVar4;
    return;
  case 7:
    bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )(other->field_0).common_.tag_;
    uVar10 = (ulong)((byte)bVar1 >> 4);
    memcpy(auStack_46,(void *)((long)&other->field_0 + 2),uVar10);
    auStack_46[uVar10] = 0;
    (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
    (other->field_0).common_.tag_ = (semantic_tag)this[1];
    (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )bVar1;
    this[1] = bVar7;
    memcpy(this + 2,auStack_46,uVar10);
    this[uVar10 + 2] =
         (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>)
         0x0;
    return;
  case 10:
  case 0xb:
    bVar1 = (other->field_0).boolean_;
    pbStack_78 = this;
    switch((byte)bVar1 & 0xf) {
    case 0:
    case 4:
      cVar8 = (other->field_0).common_;
      (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
      goto LAB_00793168;
    case 1:
      bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
               )(other->field_0).short_str_.data_[0];
      cVar8 = (other->field_0).common_;
      (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
      this[2] = bVar7;
LAB_00793168:
      *(common_storage *)this = cVar8;
      return;
    default:
      uVar5 = *(undefined8 *)&other->field_0;
      phVar9 = (other->field_0).long_str_.ptr_;
      (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
      *(undefined8 *)this = uVar5;
      *(pointer *)(this + 8) = phVar9;
      return;
    case 6:
      uVar4 = *(undefined4 *)&other->field_0;
      (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
      *(undefined4 *)this = uVar4;
      return;
    case 7:
      bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
               )(other->field_0).common_.tag_;
      uVar10 = (ulong)((byte)bVar1 >> 4);
      memcpy(auStack_8e,(void *)((long)&other->field_0 + 2),uVar10);
      auStack_8e[uVar10] = 0;
      (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
      *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
               )bVar1;
      this[1] = bVar7;
      memcpy(this + 2,auStack_8e,uVar10);
      this[uVar10 + 2] =
           (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
           )0x0;
      return;
    case 10:
    case 0xb:
      bVar1 = (other->field_0).boolean_;
      pbStack_c0 = this;
      switch((byte)bVar1 & 0xf) {
      case 0:
      case 4:
        cVar8 = (other->field_0).common_;
        phVar9 = *(pointer *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).long_str_.ptr_ = phVar9;
        goto LAB_007932b7;
      case 1:
        bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )(other->field_0).short_str_.data_[0];
        cVar8 = (other->field_0).common_;
        phVar9 = *(pointer *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).long_str_.ptr_ = phVar9;
        this[2] = bVar7;
LAB_007932b7:
        *(common_storage *)this = cVar8;
        return;
      default:
        uVar5 = *(undefined8 *)&other->field_0;
        phVar9 = (other->field_0).long_str_.ptr_;
        phVar6 = *(pointer *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).long_str_.ptr_ = phVar6;
        *(undefined8 *)this = uVar5;
        *(pointer *)(this + 8) = phVar9;
        return;
      case 6:
        uVar4 = *(undefined4 *)&other->field_0;
        phVar9 = *(pointer *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).long_str_.ptr_ = phVar9;
        *(undefined4 *)this = uVar4;
        return;
      case 7:
        bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )(other->field_0).common_.tag_;
        uVar10 = (ulong)((byte)bVar1 >> 4);
        memcpy(auStack_d6,(void *)((long)&other->field_0 + 2),uVar10);
        auStack_d6[uVar10] = 0;
        phVar9 = *(pointer *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).long_str_.ptr_ = phVar9;
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )bVar1;
        this[1] = bVar7;
        memcpy(this + 2,auStack_d6,uVar10);
        this[uVar10 + 2] =
             (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
              )0x0;
        return;
      case 10:
      case 0xb:
        bVar1 = (other->field_0).boolean_;
        pbStack_108 = this;
        switch((byte)bVar1 & 0xf) {
        case 0:
        case 4:
          cVar8 = (other->field_0).common_;
          phVar9 = *(pointer *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).long_str_.ptr_ = phVar9;
          goto LAB_007933f7;
        case 1:
          bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).short_str_.data_[0];
          cVar8 = (other->field_0).common_;
          phVar9 = *(pointer *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).long_str_.ptr_ = phVar9;
          this[2] = bVar7;
LAB_007933f7:
          *(common_storage *)this = cVar8;
          return;
        default:
          uVar5 = *(undefined8 *)&other->field_0;
          phVar9 = (other->field_0).long_str_.ptr_;
          phVar6 = *(pointer *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).long_str_.ptr_ = phVar6;
          *(undefined8 *)this = uVar5;
          *(pointer *)(this + 8) = phVar9;
          return;
        case 6:
          uVar4 = *(undefined4 *)&other->field_0;
          phVar9 = *(pointer *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).long_str_.ptr_ = phVar9;
          *(undefined4 *)this = uVar4;
          return;
        case 7:
          bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).common_.tag_;
          uVar10 = (ulong)((byte)bVar1 >> 4);
          memcpy(auStack_11e,(void *)((long)&other->field_0 + 2),uVar10);
          auStack_11e[uVar10] = 0;
          phVar9 = *(pointer *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).long_str_.ptr_ = phVar9;
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )bVar1;
          this[1] = bVar7;
          memcpy(this + 2,auStack_11e,uVar10);
          this[uVar10 + 2] =
               (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                )0x0;
          return;
        case 10:
        case 0xb:
          bVar1 = (other->field_0).boolean_;
          bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).common_.tag_;
          __src = (void *)((long)&other->field_0 + 2);
          uVar10 = (ulong)((byte)bVar1 >> 4);
          pbStack_150 = this;
          memcpy(auStack_15e,__src,uVar10);
          auStack_15e[uVar10] = 0;
          bVar2 = *this;
          (other->field_0).boolean_ = (bool_storage)((byte)bVar1 & 0xf0 | (byte)bVar2 & 0xf);
          bVar3 = *this;
          (other->field_0).boolean_ = (bool_storage)((byte)bVar3 & 0xf0 | (byte)bVar2 & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          memcpy(__src,this + 2,(ulong)((byte)*this >> 4));
          *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar3 >> 4) + 2) = 0;
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )bVar1;
          this[1] = bVar7;
          memcpy(this + 2,auStack_15e,uVar10);
          this[uVar10 + 2] =
               (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                )0x0;
          return;
        case 0xc:
          bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).common_.tag_;
          phVar9 = (other->field_0).long_str_.ptr_;
          phVar6 = *(pointer *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).long_str_.ptr_ = phVar6;
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )0xc;
          break;
        case 0xd:
          bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).common_.tag_;
          phVar9 = (other->field_0).long_str_.ptr_;
          phVar6 = *(pointer *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).long_str_.ptr_ = phVar6;
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )0xd;
          break;
        case 0xe:
          bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).common_.tag_;
          phVar9 = (other->field_0).long_str_.ptr_;
          phVar6 = *(pointer *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).long_str_.ptr_ = phVar6;
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )0xe;
          break;
        case 0xf:
          bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).common_.tag_;
          phVar9 = (other->field_0).long_str_.ptr_;
          phVar6 = *(pointer *)(this + 8);
          *(undefined8 *)&other->field_0 = *(undefined8 *)this;
          (other->field_0).long_str_.ptr_ = phVar6;
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )0xf;
        }
        this[1] = bVar7;
        *(pointer *)(this + 8) = phVar9;
        return;
      case 0xc:
        bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )(other->field_0).common_.tag_;
        phVar9 = (other->field_0).long_str_.ptr_;
        phVar6 = *(pointer *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).long_str_.ptr_ = phVar6;
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )0xc;
        break;
      case 0xd:
        bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )(other->field_0).common_.tag_;
        phVar9 = (other->field_0).long_str_.ptr_;
        phVar6 = *(pointer *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).long_str_.ptr_ = phVar6;
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )0xd;
        break;
      case 0xe:
        bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )(other->field_0).common_.tag_;
        phVar9 = (other->field_0).long_str_.ptr_;
        phVar6 = *(pointer *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).long_str_.ptr_ = phVar6;
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )0xe;
        break;
      case 0xf:
        bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )(other->field_0).common_.tag_;
        phVar9 = (other->field_0).long_str_.ptr_;
        phVar6 = *(pointer *)(this + 8);
        *(undefined8 *)&other->field_0 = *(undefined8 *)this;
        (other->field_0).long_str_.ptr_ = phVar6;
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )0xf;
      }
      this[1] = bVar7;
      *(pointer *)(this + 8) = phVar9;
      return;
    case 0xc:
      bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
               )(other->field_0).common_.tag_;
      phVar9 = (other->field_0).long_str_.ptr_;
      (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
      *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
               )0xc;
      break;
    case 0xd:
      bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
               )(other->field_0).common_.tag_;
      phVar9 = (other->field_0).long_str_.ptr_;
      (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
      *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
               )0xd;
      break;
    case 0xe:
      bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
               )(other->field_0).common_.tag_;
      phVar9 = (other->field_0).long_str_.ptr_;
      (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
      *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
               )0xe;
      break;
    case 0xf:
      bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
               )(other->field_0).common_.tag_;
      phVar9 = (other->field_0).long_str_.ptr_;
      (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
      *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
               )0xf;
    }
    this[1] = bVar7;
    *(pointer *)(this + 8) = phVar9;
    return;
  case 0xc:
    bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )(other->field_0).common_.tag_;
    phVar9 = (other->field_0).long_str_.ptr_;
    (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
    (other->field_0).common_.tag_ = (semantic_tag)this[1];
    (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )0xc;
    break;
  case 0xd:
    bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )(other->field_0).common_.tag_;
    phVar9 = (other->field_0).long_str_.ptr_;
    (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
    (other->field_0).common_.tag_ = (semantic_tag)this[1];
    (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )0xd;
    break;
  case 0xe:
    bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )(other->field_0).common_.tag_;
    phVar9 = (other->field_0).long_str_.ptr_;
    (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
    (other->field_0).common_.tag_ = (semantic_tag)this[1];
    (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )0xe;
    break;
  case 0xf:
    bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )(other->field_0).common_.tag_;
    phVar9 = (other->field_0).long_str_.ptr_;
    (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
    (other->field_0).common_.tag_ = (semantic_tag)this[1];
    (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )0xf;
  }
  this[1] = bVar7;
  *(pointer *)(this + 8) = phVar9;
  return;
}

Assistant:

void swap_l(basic_json& other) noexcept
        {
            switch (other.storage_kind())
            {
                case json_storage_kind::null         : swap_l_r<TypeL, null_storage>(other); break;
                case json_storage_kind::empty_object : swap_l_r<TypeL, empty_object_storage>(other); break;
                case json_storage_kind::boolean         : swap_l_r<TypeL, bool_storage>(other); break;
                case json_storage_kind::int64        : swap_l_r<TypeL, int64_storage>(other); break;
                case json_storage_kind::uint64       : swap_l_r<TypeL, uint64_storage>(other); break;
                case json_storage_kind::half_float         : swap_l_r<TypeL, half_storage>(other); break;
                case json_storage_kind::float64       : swap_l_r<TypeL, double_storage>(other); break;
                case json_storage_kind::short_str : swap_l_r<TypeL, short_string_storage>(other); break;
                case json_storage_kind::long_str  : swap_l_r<TypeL, long_string_storage>(other); break;
                case json_storage_kind::byte_str  : swap_l_r<TypeL, byte_string_storage>(other); break;
                case json_storage_kind::array        : swap_l_r<TypeL, array_storage>(other); break;
                case json_storage_kind::object       : swap_l_r<TypeL, object_storage>(other); break;
                case json_storage_kind::json_const_reference : swap_l_r<TypeL, json_const_reference_storage>(other); break;
                case json_storage_kind::json_reference : swap_l_r<TypeL, json_reference_storage>(other); break;
                default:
                    JSONCONS_UNREACHABLE();
                    break;
            }
        }